

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

int * getRandomTipStates(int nsites,int stateCount)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  piVar2 = (int *)calloc(4,(long)nsites);
  for (uVar3 = 0; (uint)(~(nsites >> 0x1f) & nsites) != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = gt_rand();
    piVar2[uVar3] = iVar1 % stateCount;
  }
  return piVar2;
}

Assistant:

int* getRandomTipStates( int nsites, int stateCount )
{
    int *states = (int*) calloc(sizeof(int), nsites); 
    for( int i=0; i<nsites; i++ )
    {
        int s = gt_rand()%stateCount;
        states[i]=s;
    }
    return states;
}